

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O0

void __thiscall antlr::InputBuffer::rewind(InputBuffer *this,FILE *__stream)

{
  uint uVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = (uint)__stream;
  syncConsume((InputBuffer *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  this->markerOffset = uVar1;
  this->nMarkers = this->nMarkers - 1;
  return;
}

Assistant:

void InputBuffer::rewind(unsigned int mark)
{
	syncConsume();
	markerOffset = mark;
	nMarkers--;
}